

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SC.cpp
# Opt level: O1

void __thiscall OpenMD::SC::calcForce(SC *this,InteractionData *idat)

{
  RealType *t;
  double dVar1;
  double dVar2;
  int iVar3;
  pointer piVar4;
  uint i;
  long lVar5;
  long lVar6;
  pointer pSVar7;
  pointer pSVar8;
  double dVar9;
  double dVar10;
  RealType rhtmp;
  RealType drhodr;
  Vector<double,_3U> result;
  Vector<double,_3U> result_1;
  RealType dvpdr;
  RealType vptmp;
  double local_88;
  double local_80 [5];
  double local_58 [4];
  double local_38;
  
  if (this->initialized_ == false) {
    initialize(this);
  }
  piVar4 = (this->SCtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar3 = piVar4[idat->atid1];
  lVar6 = (long)piVar4[idat->atid2];
  lVar5 = *(long *)&(this->MixingMap).
                    super__Vector_base<std::vector<OpenMD::SCInteractionData,_std::allocator<OpenMD::SCInteractionData>_>,_std::allocator<std::vector<OpenMD::SCInteractionData,_std::allocator<OpenMD::SCInteractionData>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[iVar3].
                    super__Vector_base<OpenMD::SCInteractionData,_std::allocator<OpenMD::SCInteractionData>_>
                    ._M_impl.super__Vector_impl_data;
  dVar10 = *(double *)(lVar5 + 0x20 + lVar6 * 0x48);
  if (idat->rij <= dVar10 && dVar10 != idat->rij) {
    pSVar8 = (this->SCdata).
             super__Vector_base<OpenMD::SCAtomData,_std::allocator<OpenMD::SCAtomData>_>._M_impl.
             super__Vector_impl_data._M_start;
    pSVar7 = pSVar8 + iVar3;
    pSVar8 = pSVar8 + lVar6;
    lVar5 = lVar5 + lVar6 * 0x48;
    t = &idat->rij;
    dVar10 = *(double *)(lVar5 + 0x28);
    CubicSpline::getValueAndDerivativeAt(*(CubicSpline **)(lVar5 + 0x38),t,&local_88,local_80);
    CubicSpline::getValueAndDerivativeAt(*(CubicSpline **)(lVar5 + 0x30),t,&local_38,local_58 + 3);
    dVar10 = local_38 - dVar10;
    idat->vpair = idat->vpair + dVar10;
    dVar1 = idat->dfrho1;
    dVar2 = idat->dfrho2;
    local_80[1] = 0.0;
    local_80[2] = 0.0;
    local_80[3] = 0.0;
    lVar5 = 0;
    do {
      local_80[lVar5 + 1] =
           (idat->d).super_Vector<double,_3U>.data_[lVar5] *
           ((dVar1 + dVar2) * local_80[0] + local_58[3]);
      lVar5 = lVar5 + 1;
    } while (lVar5 != 3);
    dVar1 = *t;
    local_58[0] = 0.0;
    local_58[1] = 0.0;
    local_58[2] = 0.0;
    lVar5 = 0;
    do {
      local_58[lVar5] = local_80[lVar5 + 1] / dVar1;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 3);
    lVar5 = 0;
    do {
      (idat->f1).super_Vector<double,_3U>.data_[lVar5] =
           local_58[lVar5] + (idat->f1).super_Vector<double,_3U>.data_[lVar5];
      lVar5 = lVar5 + 1;
    } while (lVar5 != 3);
    if (idat->doParticlePot == true) {
      dVar1 = pSVar8->c;
      dVar2 = pSVar8->epsilon;
      dVar9 = idat->rho2 - local_88;
      if (dVar9 < 0.0) {
        dVar9 = sqrt(dVar9);
      }
      else {
        dVar9 = SQRT(dVar9);
      }
      idat->particlePot1 = idat->particlePot1 - (dVar1 * dVar2 * dVar9 + idat->frho2);
      dVar1 = pSVar7->c;
      dVar2 = pSVar7->epsilon;
      local_88 = idat->rho1 - local_88;
      if (local_88 < 0.0) {
        local_88 = sqrt(local_88);
      }
      else {
        local_88 = SQRT(local_88);
      }
      idat->particlePot2 = idat->particlePot2 - (dVar1 * dVar2 * local_88 + idat->frho1);
    }
    (idat->pot).data_[4] = (idat->pot).data_[4] + dVar10;
    if (idat->isSelected == true) {
      (idat->selePot).data_[4] = dVar10 + (idat->selePot).data_[4];
    }
  }
  return;
}

Assistant:

void SC::calcForce(InteractionData& idat) {
    if (!initialized_) initialize();

    int& sctid1 = SCtids[idat.atid1];
    int& sctid2 = SCtids[idat.atid2];

    SCAtomData& data1 = SCdata[sctid1];
    SCAtomData& data2 = SCdata[sctid2];

    SCInteractionData& mixer = MixingMap[sctid1][sctid2];

    RealType rcij = mixer.rCut;

    if (idat.rij < rcij) {
      RealType vcij = mixer.vCut;
      RealType rhtmp, drhodr, vptmp, dvpdr;

      mixer.phi->getValueAndDerivativeAt(idat.rij, rhtmp, drhodr);
      mixer.V->getValueAndDerivativeAt(idat.rij, vptmp, dvpdr);

      RealType pot_temp = vptmp - vcij;
      idat.vpair += pot_temp;

      RealType dudr = drhodr * (idat.dfrho1 + idat.dfrho2) + dvpdr;

      idat.f1 += idat.d * dudr / idat.rij;

      if (idat.doParticlePot) {
        // particlePot is the difference between the full potential and
        // the full potential without the presence of a particular
        // particle (atom1).
        //
        // This reduces the density at other particle locations, so we
        // need to recompute the density at atom2 assuming atom1 didn't
        // contribute.  This then requires recomputing the density
        // functional for atom2 as well.

        idat.particlePot1 -=
            data2.c * data2.epsilon * sqrt(idat.rho2 - rhtmp) + idat.frho2;

        idat.particlePot2 -=
            data1.c * data1.epsilon * sqrt(idat.rho1 - rhtmp) + idat.frho1;
      }

      idat.pot[METALLIC_PAIR_FAMILY] += pot_temp;

      if (idat.isSelected) idat.selePot[METALLIC_PAIR_FAMILY] += pot_temp;
    }

    return;
  }